

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O1

bool __thiscall QRowsRemoval::contains(QRowsRemoval *this,QModelIndex parent,int row)

{
  int iVar1;
  bool bVar2;
  long in_FS_OFFSET;
  undefined8 local_48;
  quintptr local_40;
  QAbstractItemModel *pQStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    iVar1 = parent.r;
    if ((((parent.r == (this->parent_source).r) && (parent.c == (this->parent_source).c)) &&
        (parent.i == (this->parent_source).i)) && (parent.m.ptr == (this->parent_source).m.ptr)) {
      bVar2 = row <= this->end && this->start <= row;
      goto LAB_0048d21c;
    }
    if (parent.m.ptr == (QAbstractItemModel *)0x0) {
      local_48 = 0xffffffffffffffff;
      local_40 = 0;
      pQStack_38 = (QAbstractItemModel *)0x0;
    }
    else {
      (*((parent.m.ptr)->super_QObject)._vptr_QObject[0xd])(&local_48,parent.m.ptr,&parent);
    }
    parent.m.ptr = pQStack_38;
    parent.r = (int)local_48;
    parent.c = (int)((ulong)local_48 >> 0x20);
    parent.i = local_40;
    row = iVar1;
  } while (-1 < iVar1);
  bVar2 = false;
LAB_0048d21c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool contains(QModelIndex parent, int row) const
    {
        do {
            if (parent == parent_source)
                return row >= start && row <= end;
            row = parent.row();
            parent = parent.parent();
        } while (row >= 0);
        return false;
    }